

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

_Bool bson_iter_as_bool(bson_iter_t *iter)

{
  size_t *psVar1;
  long *plVar2;
  uint8_t uVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  long lVar8;
  int64_t iVar9;
  undefined1 uVar10;
  char cVar11;
  _Bool _Var12;
  int iVar13;
  void *pvVar14;
  undefined8 uVar15;
  long lVar16;
  size_t sVar17;
  char *pcVar18;
  code *pcVar19;
  bson_oid_t *pbVar20;
  char *__s;
  size_t nbytes;
  ulong uVar21;
  uint32_t uVar22;
  ulong *in_RCX;
  uint8_t *puVar23;
  uint8_t *puVar24;
  ulong uVar25;
  int32_t iVar26;
  undefined4 *extraout_RDX;
  ulong *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var27;
  bson_t *in_RSI;
  anon_union_24_17_78d57918_for_value *dst;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  bson_t *pbVar28;
  uint uVar29;
  bool bVar30;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [35];
  
  if (iter != (bson_iter_t *)0x0) {
    puVar23 = iter->raw;
    uVar3 = puVar23[iter->type];
    switch(uVar3) {
    case '\x01':
      return (_Bool)(-(*(double *)(puVar23 + iter->d1) != 0.0) & 1);
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      return true;
    case '\x06':
    case '\n':
      return false;
    case '\b':
      bVar30 = puVar23[iter->d1] == '\0';
      break;
    default:
      if (uVar3 == '\x10') {
        bVar30 = *(int *)(puVar23 + iter->d1) == 0;
      }
      else {
        if (uVar3 != '\x12') {
          return true;
        }
        bVar30 = *(long *)(puVar23 + iter->d1) == 0;
      }
    }
    return !bVar30;
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return SUB81((((bson_json_reader_t *)iter)->producer).data,0);
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x12') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar10 = 0;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      uVar10 = (undefined1)
               *(undefined4 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return (_Bool)uVar10;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar4 = puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    _Var12 = SUB81(puVar23,0);
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return _Var12;
      }
      if ((bVar4 == 8) && (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0'))
      {
        return _Var12;
      }
    }
    else if ((bVar4 != 0x10) && (bVar4 == 0x12)) {
      return _Var12;
    }
    return _Var12;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar4 = puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    uVar10 = 0;
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return SUB81((long)*(double *)
                            (puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0);
      }
      if (bVar4 == 8) {
        return puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0';
      }
    }
    else if (bVar4 == 0x10) {
      uVar10 = (undefined1)
               *(undefined4 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else if (bVar4 == 0x12) {
      return SUB81(*(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                   ,0);
    }
    return (_Bool)uVar10;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar3 = puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (uVar3 == '\x13') {
      plVar2 = (long *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      lVar16 = *plVar2;
      lVar8 = plVar2[1];
      in_RSI->flags = (int)lVar16;
      in_RSI->len = (int)((ulong)lVar16 >> 0x20);
      *(long *)in_RSI->padding = lVar8;
    }
    return uVar3 == '\x13';
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\a') {
      return false;
    }
    return (_Bool)((char)puVar23 + (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf)
    ;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      cVar11 = (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf + (char)puVar23;
      puVar23 = puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      cVar11 = '\0';
      puVar23 = (uint8_t *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      *(uint8_t **)in_RSI = puVar23;
    }
    return (_Bool)cVar11;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return false;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar13 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar13 - 1;
    }
    return (_Bool)((char)puVar23 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      iVar13 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar29 = iVar13 - 1;
      puVar23 = puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      uVar29 = 0;
      puVar23 = (uint8_t *)0x0;
    }
    if (puVar23 == (uint8_t *)0x0) {
      pvVar14 = (void *)0x0;
    }
    else {
      pvVar14 = bson_malloc0((ulong)(uVar29 + 1));
      memcpy(pvVar14,puVar23,(ulong)uVar29);
      *(undefined1 *)((long)pvVar14 + (ulong)uVar29) = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar29;
    }
    return SUB81(pvVar14,0);
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return false;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar13 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar13 - 1;
    }
    return (_Bool)((char)puVar23 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      return false;
    }
    if (in_RSI == (bson_t *)0x0) {
LAB_001113bb:
      *extraout_RDX =
           *(undefined4 *)
            (puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (ulong)(puVar23 +
                       *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (_Bool)((char)(uint32_t)(((bson_json_reader_t *)iter)->producer).buf_size +
                    (char)(((bson_json_reader_t *)iter)->producer).data);
    }
    if (*(int *)(puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      in_RSI->flags =
           *(int *)(puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_001113bb;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (ulong *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = 0;
    }
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if (in_RSI != (bson_t *)0x0) {
        uVar29 = *(uint *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar23 = (uint8_t *)(ulong)uVar29;
        in_RSI->flags = uVar29;
        if (uVar29 != 0) {
          puVar23 = (uint8_t *)(ulong)(uVar29 - 1);
          in_RSI->flags = uVar29 - 1;
        }
      }
      if (extraout_RDX_00 != (ulong *)0x0) {
        puVar23 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_00 = (ulong)puVar23;
      }
      if (in_RCX != (ulong *)0x0) {
        puVar23 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar23;
      }
    }
    return SUB81(puVar23,0);
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      cVar11 = (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) +
               (char)puVar23;
      iVar13 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar22 = iVar13 - 1;
    }
    else {
      cVar11 = '\0';
      uVar22 = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar22;
    }
    return (_Bool)cVar11;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(ulong *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) / 1000
                 ,0);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar22 = 0;
    uVar15 = 0;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar15 = *(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar22 = (uint32_t)((ulong)uVar15 >> 0x20);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar22;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)uVar15;
    }
    return SUB81(uVar15,0);
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      in_RSI->flags = 0;
      in_RSI->len = 0;
      in_RSI->padding[0] = '\0';
      in_RSI->padding[1] = '\0';
      in_RSI->padding[2] = '\0';
      in_RSI->padding[3] = '\0';
      in_RSI->padding[4] = '\0';
      in_RSI->padding[5] = '\0';
      in_RSI->padding[6] = '\0';
      in_RSI->padding[7] = '\0';
      return SUB81(puVar23,0);
    }
    lVar16 = *(long *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)in_RSI = lVar16 / 1000;
    lVar16 = (lVar16 % 1000) * 1000;
    *(long *)in_RSI->padding = lVar16;
    return SUB81(lVar16,0);
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    _Var12 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    if (_Var12) {
      do {
        puVar23 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar17 = strlen((char *)puStack_208);
          _Var12 = bson_utf8_validate((char *)puVar23,sVar17,false);
          if (!_Var12) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)in_RSI != (code *)0x0) &&
           (cVar11 = (**(code **)in_RSI)(iter,puVar23,extraout_RDX_02), cVar11 != '\0')) {
          return true;
        }
        switch(uStack_210) {
        case 1:
          pcVar19 = *(code **)(in_RSI->padding + 0x10);
          if (pcVar19 == (code *)0x0) break;
          dVar7 = bson_iter_double(iter);
          cVar11 = (*pcVar19)(SUB84(dVar7,0),iter,puVar23,extraout_RDX_02);
          goto LAB_00111ad6;
        case 2:
          pcVar18 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var12 = bson_utf8_validate(pcVar18,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var12) {
LAB_00111b8c:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return true;
          }
          pcVar19 = *(code **)(in_RSI->padding + 0x18);
          goto LAB_001119f8;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var12 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220)
          ;
          if (_Var12) {
            pcVar19 = *(code **)(in_RSI->padding + 0x20);
            goto LAB_00111a42;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var12 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220)
          ;
          if (_Var12) {
            pcVar19 = *(code **)(in_RSI->padding + 0x28);
            goto LAB_00111a42;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(in_RSI->padding + 0x30) != (code *)0x0) {
            cVar11 = (**(code **)(in_RSI->padding + 0x30))
                               (iter,puVar23,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 6:
          pcVar19 = *(code **)(in_RSI->padding + 0x38);
          goto LAB_001119ae;
        case 7:
          pcVar19 = *(code **)(in_RSI->padding + 0x40);
          if (pcVar19 != (code *)0x0) {
            pbVar20 = bson_iter_oid(iter);
LAB_00111ac7:
            cVar11 = (*pcVar19)(iter,puVar23,pbVar20,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 8:
          pcVar19 = *(code **)(in_RSI->padding + 0x48);
          if (pcVar19 != (code *)0x0) {
            _Var12 = bson_iter_bool(iter);
            uVar29 = (uint)_Var12;
LAB_00111934:
            cVar11 = (*pcVar19)(iter,puVar23,uVar29,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 9:
          pcVar19 = *(code **)(in_RSI->padding + 0x50);
          if (pcVar19 != (code *)0x0) {
            pbVar20 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_00111ac7;
          }
          break;
        case 10:
          pcVar19 = *(code **)(in_RSI->padding + 0x58);
LAB_001119ae:
          if (pcVar19 == (code *)0x0) break;
LAB_001119bd:
          cVar11 = (*pcVar19)(iter,puVar23,extraout_RDX_02);
          goto LAB_00111ad6;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar17 = strlen(__s);
          _Var12 = bson_utf8_validate(__s,sVar17,true);
          if (!_Var12) goto LAB_00111b8c;
          pcVar19 = *(code **)(in_RSI->padding + 0x60);
          pcVar18 = apcStack_200[0];
          if (pcVar19 == (code *)0x0) break;
          goto LAB_00111aaf;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var12 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          if (!_Var12) goto LAB_00111b8c;
          pcVar19 = *(code **)(in_RSI->padding + 0x68);
          pcVar18 = apcStack_200[0];
          pbVar28 = pbStack_218;
          if (pcVar19 != (code *)0x0) {
LAB_001117cc:
            cVar11 = (*pcVar19)(iter,puVar23,uStack_220,pcVar18,pbVar28,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 0xd:
          pcVar18 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var12 = bson_utf8_validate(pcVar18,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var12) goto LAB_00111b8c;
          pcVar19 = *(code **)(in_RSI->padding + 0x70);
          goto LAB_001119f8;
        case 0xe:
          pcVar18 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var12 = bson_utf8_validate(pcVar18,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var12) goto LAB_00111b8c;
          pcVar19 = *(code **)(in_RSI + 1);
LAB_001119f8:
          if (pcVar19 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_00111aaf:
            cVar11 = (*pcVar19)(iter,puVar23,__s,pcVar18,extraout_RDX_02);
LAB_00111ad6:
            if (cVar11 != '\0') {
              return true;
            }
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar18 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var12 = bson_utf8_validate(pcVar18,(ulong)uStack_220,true);
          if (!_Var12) goto LAB_00111b8c;
          _Var12 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c)
          ;
          if ((_Var12) && (pcVar19 = *(code **)in_RSI[1].padding, pcVar19 != (code *)0x0)) {
            pbVar28 = (bson_t *)apcStack_200;
            goto LAB_001117cc;
          }
          break;
        case 0x10:
          pcVar19 = *(code **)(in_RSI[1].padding + 8);
          if (pcVar19 != (code *)0x0) {
            uVar29 = bson_iter_int32(iter);
            goto LAB_00111934;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(in_RSI[1].padding + 0x10) != (code *)0x0) {
            cVar11 = (**(code **)(in_RSI[1].padding + 0x10))
                               (iter,puVar23,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 0x12:
          pcVar19 = *(code **)(in_RSI[1].padding + 0x18);
          if (pcVar19 != (code *)0x0) {
            pbVar20 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_00111ac7;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar19 = *(code **)(in_RSI[1].padding + 0x38);
LAB_00111a42:
          if (pcVar19 != (code *)0x0) {
            cVar11 = (*pcVar19)(iter,puVar23,(bson_t *)apcStack_200,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar19 = *(code **)(in_RSI[1].padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar19 = *(code **)(in_RSI[1].padding + 0x28);
          }
          if (pcVar19 == (code *)0x0) break;
          puVar23 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_001119bd;
        }
        if ((*(code **)in_RSI->padding != (code *)0x0) &&
           (cVar11 = (**(code **)in_RSI->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_02), cVar11 != '\0')) {
          return true;
        }
        _Var12 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
      } while (_Var12);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) && (*(long *)(in_RSI[1].padding + 0x30) != 0)) {
        sVar17 = strlen((char *)puStack_208);
        _Var12 = bson_utf8_validate((char *)puStack_208,sVar17,false);
        if (_Var12) {
          (**(code **)(in_RSI[1].padding + 0x30))(iter,puStack_208,uStack_210,extraout_RDX_02);
          return false;
        }
      }
      if (*(code **)(in_RSI->padding + 8) != (code *)0x0) {
        (**(code **)(in_RSI->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return false;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)in_RSI;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)in_RSI;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_t **)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = in_RSI;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar29 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar16 = *(long *)in_RSI->padding;
      *(long *)(puVar23 + uVar29) = *(long *)in_RSI;
      *(long *)((long)(puVar23 + uVar29) + 8) = lVar16;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if (in_RSI != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = in_RSI;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      iVar13 = 0;
      while( true ) {
        sVar5 = ((bson_json_reader_t *)iter)->json->pos;
        nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          iVar13 = -1;
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          goto LAB_00111fff;
        }
        if (nbytes == 0) goto LAB_00111fff;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar23 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar23,puVar23 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          iVar13 = 1;
          goto LAB_00111fff;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) break;
        uVar25 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar25 != 0xffffffffffffffff) &&
           (uVar6 = ((bson_json_reader_t *)iter)->json->pos, uVar21 = uVar6 - uVar25,
           uVar25 <= uVar6 && uVar21 != 0)) {
          if (uVar21 < nbytes) {
            nbytes = uVar21;
          }
          lVar16 = uVar25 - sVar5;
          if (lVar16 < 1) {
            lVar16 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar16,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        iVar13 = 1;
      }
      iVar13 = -1;
LAB_00111fff:
      if ((iVar13 == 1) && ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE)) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        iVar13 = -1;
      }
      return SUB41(iVar13,0);
    }
    bson_json_reader_read_cold_1();
    p_Var27 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var27 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
    }
    else if ((((bson_json_reader_t *)iter)->producer).cb < p_Var27 + __n + 1) {
      uVar25 = (ulong)(p_Var27 + __n) >> 1 | (ulong)(p_Var27 + __n);
      uVar25 = uVar25 >> 2 | uVar25;
      uVar25 = uVar25 >> 4 | uVar25;
      uVar25 = uVar25 >> 8 | uVar25;
      uVar25 = uVar25 >> 0x10 | uVar25;
      num_bytes = (bson_json_reader_cb)((uVar25 >> 0x20 | uVar25) + 1);
      (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
      pvVar14 = bson_realloc((((bson_json_reader_t *)iter)->producer).data,(size_t)num_bytes);
      (((bson_json_reader_t *)iter)->producer).data = pvVar14;
    }
    memcpy((((bson_json_reader_t *)iter)->producer).dcb +
           (long)(((bson_json_reader_t *)iter)->producer).data,in_RSI,__n);
    p_Var27 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var27;
    pvVar14 = (((bson_json_reader_t *)iter)->producer).data;
    p_Var27[(long)pvVar14] = (_func_void_void_ptr)0x0;
    return SUB81(pvVar14,0);
  }
  puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar29 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar4 = puVar23[uVar29];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar4
  ;
  switch(bVar4) {
  case 1:
    dVar7 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar7;
    break;
  case 2:
    pcVar18 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar20 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111da5;
  case 8:
    _Var12 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var12;
    break;
  case 9:
    pcVar18 = (char *)bson_iter_date_time(iter);
    goto LAB_00111e4c;
  case 0xb:
    pcVar18 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar20 = (bson_oid_t *)0x0;
    if (puVar23[uVar29] == '\f') {
      uVar29 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar13 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar13 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar23 + uVar29);
      pbVar20 = (bson_oid_t *)(puVar23 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111da5:
    bson_oid_copy(pbVar20,&dst->v_oid);
    break;
  case 0xd:
    if (puVar23[uVar29] == '\r') {
      iVar13 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar29 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13 + -1;
      puVar24 = puVar23 + uVar29;
    }
    else {
      *(undefined4 *)&((bson_json_reader_t *)iter)->field_0x40 = 0;
      puVar24 = (uint8_t *)0x0;
    }
    goto LAB_00111e59;
  case 0xe:
    if (puVar23[uVar29] == '\x0e') {
      puVar24 = puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar13 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar13 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar13 = iVar13 + -1;
    }
    else {
      puVar24 = (uint8_t *)0x0;
      iVar13 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar13;
LAB_00111e59:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar24;
    break;
  case 0xf:
    pcVar18 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0x10:
    iVar26 = 0;
    if (puVar23[uVar29] == '\x10') {
      iVar26 = *(int32_t *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar26;
    break;
  case 0x11:
    iVar26 = 0;
    uVar15 = 0;
    if (puVar23[uVar29] == '\x11') {
      uVar15 = *(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar26 = (int32_t)((ulong)uVar15 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar26;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar15;
    break;
  case 0x12:
    if (puVar23[uVar29] == '\x12') {
      pcVar18 = *(char **)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar18 = (char *)0x0;
    }
LAB_00111e4c:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar18;
    break;
  case 0x13:
    if (puVar23[uVar29] == '\x13') {
      iVar9 = *(int64_t *)
               ((long)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
    }
    break;
  default:
    if ((bVar4 != BSON_TYPE_MAXKEY) && (bVar4 != 0xff)) {
      return false;
    }
  }
  return (_Bool)((char)iter + '0');
}

Assistant:

bool
bson_iter_as_bool (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return !(bson_iter_double (iter) == 0.0);
   case BSON_TYPE_INT64:
      return !(bson_iter_int64 (iter) == 0);
   case BSON_TYPE_INT32:
      return !(bson_iter_int32 (iter) == 0);
   case BSON_TYPE_UTF8:
      return true;
   case BSON_TYPE_NULL:
   case BSON_TYPE_UNDEFINED:
      return false;
   default:
      return true;
   }
}